

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O0

offset_type unicpp::get_codepoint_distance(string *str,const_iterator *b,const_iterator *it)

{
  codepoint_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __first;
  codepoint_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __last;
  offset_type oVar1;
  const_iterator *it_local;
  const_iterator *b_local;
  string *str_local;
  
  __first.internal_string = b->internal_string;
  __first.internal_it._M_current = (b->internal_it)._M_current;
  __last.internal_string = it->internal_string;
  __last.internal_it._M_current = (it->internal_it)._M_current;
  oVar1 = std::
          distance<unicpp::codepoint_iterator<std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                    (__first,__last);
  return oVar1;
}

Assistant:

as_codepoints::offset_type get_codepoint_distance(const string & str, const as_codepoints::const_iterator & b, const as_codepoints::const_iterator & it)
{
    return std::distance(b, it);
}